

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

Channel __thiscall cali::Caliper::get_channel(Caliper *this,cali_id_t id)

{
  int *piVar1;
  undefined8 *puVar2;
  GlobalData *pGVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  Channel CVar7;
  Channel CVar8;
  Channel CVar9;
  
  puVar4 = *(undefined8 **)(*(long *)(id + 8) + 0x8100);
  puVar2 = *(undefined8 **)(*(long *)(id + 8) + 0x8108);
  lVar6 = (long)puVar2 - (long)puVar4 >> 6;
  puVar5 = puVar4;
  if (0 < lVar6) {
    puVar5 = (undefined8 *)(((long)puVar2 - (long)puVar4 & 0xffffffffffffffc0U) + (long)puVar4);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 4;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar4[-4] == in_RDX._M_pi) {
        puVar4 = puVar4 + -4;
        goto LAB_001e38c3;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar4[-2] == in_RDX._M_pi) {
        puVar4 = puVar4 + -2;
        goto LAB_001e38c3;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar4 == in_RDX._M_pi)
      goto LAB_001e38c3;
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar4[2] == in_RDX._M_pi) {
        puVar4 = puVar4 + 2;
        goto LAB_001e38c3;
      }
      lVar6 = lVar6 + -1;
      puVar4 = puVar4 + 8;
    } while (1 < lVar6);
  }
  lVar6 = (long)puVar2 - (long)puVar5 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      puVar4 = puVar2;
      if ((lVar6 != 3) ||
         (puVar4 = puVar5, *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 == in_RDX._M_pi
         )) goto LAB_001e38c3;
      puVar5 = puVar5 + 2;
    }
    puVar4 = puVar5;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 == in_RDX._M_pi)
    goto LAB_001e38c3;
    puVar5 = puVar5 + 2;
  }
  puVar4 = puVar5;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 != in_RDX._M_pi) {
    puVar4 = puVar2;
  }
LAB_001e38c3:
  if (puVar4 == puVar2) {
    (this->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface =
         (_func_int **)0x0;
    this->sG = (GlobalData *)0x0;
    CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Channel)CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
  }
  (this->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface =
       (_func_int **)*puVar4;
  pGVar3 = (GlobalData *)puVar4[1];
  this->sG = pGVar3;
  if (pGVar3 != (GlobalData *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      piVar1 = &(pGVar3->attribute_lock).super___mutex_base._M_mutex.__data.__owner;
      *piVar1 = *piVar1 + 1;
      CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Channel)CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    piVar1 = &(pGVar3->attribute_lock).super___mutex_base._M_mutex.__data.__owner;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel Caliper::get_channel(cali_id_t id)
{
    auto it = std::find_if(sG->all_channels.begin(), sG->all_channels.end(), [id](const Channel& channel) {
        return id == channel.id();
    });

    return it == sG->all_channels.end() ? Channel() : *it;
}